

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

char * nlohmann::detail::
       lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       ::token_type_name(token_type t)

{
  if (t < (literal_or_value|literal_true)) {
    return &DAT_00489244 + *(int *)(&DAT_00489244 + (ulong)t * 4);
  }
  return "unknown token";
}

Assistant:

static const char* token_type_name(const token_type t) noexcept {
		switch (t) {
			case token_type::uninitialized:
				return "<uninitialized>";
			case token_type::literal_true:
				return "true literal";
			case token_type::literal_false:
				return "false literal";
			case token_type::literal_null:
				return "null literal";
			case token_type::value_string:
				return "string literal";
			case lexer::token_type::value_unsigned:
			case lexer::token_type::value_integer:
			case lexer::token_type::value_float:
				return "number literal";
			case token_type::begin_array:
				return "'['";
			case token_type::begin_object:
				return "'{'";
			case token_type::end_array:
				return "']'";
			case token_type::end_object:
				return "'}'";
			case token_type::name_separator:
				return "':'";
			case token_type::value_separator:
				return "','";
			case token_type::parse_error:
				return "<parse error>";
			case token_type::end_of_input:
				return "end of input";
			case token_type::literal_or_value:
				return "'[', '{', or a literal";
			// LCOV_EXCL_START
			default:  // catch non-enum values
				return "unknown token";
				// LCOV_EXCL_STOP
		}
	}